

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O1

Expression * __thiscall
slang::ast::ReplicatedAssignmentPatternExpression::forFixedArray
          (ReplicatedAssignmentPatternExpression *this,Compilation *comp,
          ReplicatedAssignmentPatternSyntax *syntax,ASTContext *context,Type *type,Type *elementType
          ,bitwidth_t numElements,SourceRange sourceRange)

{
  ExpressionSyntax *syntax_00;
  SourceRange sourceRange_00;
  bool bVar1;
  Expression *pEVar2;
  ReplicatedAssignmentPatternExpression *expr;
  uint uVar3;
  bool bad;
  undefined4 in_stack_0000000c;
  size_t count;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> elems;
  undefined4 in_stack_ffffffffffffffb0;
  char cVar4;
  Type *local_48;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_40;
  
  uVar3 = (uint)elementType;
  local_48 = (Type *)0x0;
  syntax_00 = *(ExpressionSyntax **)&(comp->options).maxConstexprBacktrace;
  if (syntax_00 == (ExpressionSyntax *)0x0) {
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,
               "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
              );
  }
  pEVar2 = bindReplCount((Compilation *)this,syntax_00,(ASTContext *)syntax,(size_t *)&local_48);
  bVar1 = Expression::bad(pEVar2);
  if (bVar1) {
    pEVar2 = Expression::badExpr((Compilation *)this,(Expression *)0x0);
    return pEVar2;
  }
  cVar4 = '\0';
  sourceRange_00.endLoc = (SourceLocation)&stack0xffffffffffffffb3;
  sourceRange_00.startLoc = sourceRange.startLoc;
  local_40 = bindExpressionList((ast *)context,type,local_48,(ulong)uVar3,(int)comp + 0x38,
                                (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)syntax,
                                (ASTContext *)CONCAT44(in_stack_0000000c,numElements),sourceRange_00
                                ,(bool *)(CONCAT44(uVar3,in_stack_ffffffffffffffb0) &
                                         0xffffffff00ffffff));
  expr = BumpAllocator::
         emplace<slang::ast::ReplicatedAssignmentPatternExpression,slang::ast::Type_const&,slang::ast::Expression_const&,nonstd::span_lite::span<slang::ast::Expression_const*const,18446744073709551615ul>&,slang::SourceRange&>
                   ((BumpAllocator *)this,(Type *)context,pEVar2,&local_40,
                    (SourceRange *)&numElements);
  if (cVar4 == '\x01') {
    expr = (ReplicatedAssignmentPatternExpression *)
           Expression::badExpr((Compilation *)this,(Expression *)expr);
  }
  return (Expression *)expr;
}

Assistant:

Expression& ReplicatedAssignmentPatternExpression::forFixedArray(
    Compilation& comp, const ReplicatedAssignmentPatternSyntax& syntax, const ASTContext& context,
    const Type& type, const Type& elementType, bitwidth_t numElements, SourceRange sourceRange) {

    size_t count = 0;
    auto& countExpr = bindReplCount(comp, *syntax.countExpr, context, count);
    if (countExpr.bad())
        return badExpr(comp, nullptr);

    bool bad = false;
    auto elems = bindExpressionList(type, elementType, count, numElements, syntax.items, context,
                                    sourceRange, bad);

    auto result = comp.emplace<ReplicatedAssignmentPatternExpression>(type, countExpr, elems,
                                                                      sourceRange);
    if (bad)
        return badExpr(comp, result);

    return *result;
}